

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::Data_abi_cxx11_
          (string *__return_storage_ptr__,TextFormatDecodeData *this)

{
  pointer ppVar1;
  pointer data;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  int size;
  ulong uVar6;
  pointer ppVar7;
  ulong uVar8;
  size_t __n;
  CodedOutputStream output_stream;
  OstreamOutputStream data_outputstream;
  ostringstream data_stringstream;
  CodedOutputStream local_240;
  OstreamOutputStream local_1f0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::OstreamOutputStream::OstreamOutputStream(&local_1f0,(ostream *)local_1a8,-1);
    io::CodedOutputStream::CodedOutputStream(&local_240,&local_1f0.super_ZeroCopyOutputStream,true);
    ppVar7 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar1 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_240.impl_.end_ <= local_240.cur_) {
      local_240.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_240.impl_,local_240.cur_)
      ;
    }
    uVar8 = ((long)ppVar7 - (long)ppVar1 >> 3) * -0x3333333333333333;
    *local_240.cur_ = (byte)uVar8;
    if ((uint)uVar8 < 0x80) {
      pbVar4 = local_240.cur_ + 1;
    }
    else {
      *local_240.cur_ = (byte)uVar8 | 0x80;
      uVar6 = uVar8 >> 7 & 0x1ffffff;
      local_240.cur_[1] = (byte)uVar6;
      pbVar4 = local_240.cur_ + 2;
      if (0x3fff < (uint)uVar8) {
        uVar8 = (ulong)local_240.cur_[1];
        do {
          pbVar4[-1] = (byte)uVar8 | 0x80;
          uVar8 = uVar6 >> 7;
          *pbVar4 = (byte)uVar8;
          pbVar4 = pbVar4 + 1;
          uVar5 = (uint)uVar6;
          uVar6 = uVar8;
        } while (0x3fff < uVar5);
      }
    }
    ppVar7 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_240.cur_ = pbVar4;
    if (ppVar7 != (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        uVar5 = ppVar7->first;
        if (local_240.impl_.end_ <= local_240.cur_) {
          local_240.cur_ =
               io::EpsCopyOutputStream::EnsureSpaceFallback(&local_240.impl_,local_240.cur_);
        }
        *local_240.cur_ = (byte)uVar5;
        if (uVar5 < 0x80) {
          pbVar4 = local_240.cur_ + 1;
        }
        else {
          *local_240.cur_ = (byte)uVar5 | 0x80;
          local_240.cur_[1] = (byte)(uVar5 >> 7);
          pbVar4 = local_240.cur_ + 2;
          if (0x3fff < uVar5) {
            uVar3 = (uint)local_240.cur_[1];
            uVar5 = uVar5 >> 7;
            do {
              pbVar4[-1] = (byte)uVar3 | 0x80;
              uVar3 = uVar5 >> 7;
              *pbVar4 = (byte)uVar3;
              pbVar4 = pbVar4 + 1;
              bVar2 = 0x3fff < uVar5;
              uVar5 = uVar3;
            } while (bVar2);
          }
        }
        data = (ppVar7->second)._M_dataplus._M_p;
        size = (int)(ppVar7->second)._M_string_length;
        __n = (size_t)size;
        local_240.cur_ = pbVar4;
        if ((long)local_240.impl_.end_ - (long)pbVar4 < (long)__n) {
          local_240.cur_ =
               io::EpsCopyOutputStream::WriteRawFallback(&local_240.impl_,data,size,pbVar4);
        }
        else {
          memcpy(pbVar4,data,__n);
          local_240.cur_ = pbVar4 + __n;
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != (this->entries_).
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    io::CodedOutputStream::~CodedOutputStream(&local_240);
    io::OstreamOutputStream::~OstreamOutputStream(&local_1f0);
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormatDecodeData::Data() const {
  std::ostringstream data_stringstream;

  if (num_entries() > 0) {
    io::OstreamOutputStream data_outputstream(&data_stringstream);
    io::CodedOutputStream output_stream(&data_outputstream);

    output_stream.WriteVarint32(num_entries());
    for (std::vector<DataEntry>::const_iterator i = entries_.begin();
         i != entries_.end(); ++i) {
      output_stream.WriteVarint32(i->first);
      output_stream.WriteString(i->second);
    }
  }

  data_stringstream.flush();
  return data_stringstream.str();
}